

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::draw_range(Fl_Text_Display *this,int startpos,int endpos)

{
  int iVar1;
  int iVar2;
  Fl_Text_Buffer *pFVar3;
  int local_44;
  int local_2c;
  int endIndex;
  int startIndex;
  int lastLine;
  int startLine;
  int i;
  int endpos_local;
  int startpos_local;
  Fl_Text_Display *this_local;
  
  startLine = endpos;
  i = startpos;
  _endpos_local = this;
  pFVar3 = buffer(this);
  i = Fl_Text_Buffer::utf8_align(pFVar3,i);
  pFVar3 = buffer(this);
  startLine = Fl_Text_Buffer::utf8_align(pFVar3,startLine);
  if ((this->mFirstChar <= startLine) &&
     ((i <= this->mLastChar || (iVar1 = empty_vlines(this), iVar1 != 0)))) {
    if (i < 0) {
      i = 0;
    }
    iVar1 = i;
    iVar2 = Fl_Text_Buffer::length(this->mBuffer);
    if (iVar2 < iVar1) {
      i = Fl_Text_Buffer::length(this->mBuffer);
    }
    if (startLine < 0) {
      startLine = 0;
    }
    iVar1 = startLine;
    iVar2 = Fl_Text_Buffer::length(this->mBuffer);
    if (iVar2 < iVar1) {
      startLine = Fl_Text_Buffer::length(this->mBuffer);
    }
    if (i < this->mFirstChar) {
      i = this->mFirstChar;
    }
    iVar1 = position_to_line(this,i,&startIndex);
    if (iVar1 == 0) {
      startIndex = this->mNVisibleLines + -1;
    }
    if (startLine < this->mLastChar) {
      iVar1 = position_to_line(this,startLine,&endIndex);
      if (iVar1 == 0) {
        endIndex = this->mNVisibleLines + -1;
      }
    }
    else {
      endIndex = this->mNVisibleLines + -1;
    }
    if (this->mLineStarts[startIndex] == -1) {
      local_44 = 0;
    }
    else {
      local_44 = i - this->mLineStarts[startIndex];
    }
    if (startLine < this->mLastChar) {
      if (this->mLineStarts[endIndex] == -1) {
        local_2c = 0;
      }
      else {
        local_2c = startLine - this->mLineStarts[endIndex];
      }
    }
    else {
      local_2c = 0x7fffffff;
    }
    if (startIndex == endIndex) {
      draw_vline(this,startIndex,0,0x7fffffff,local_44,local_2c);
    }
    else {
      draw_vline(this,startIndex,0,0x7fffffff,local_44,0x7fffffff);
      lastLine = startIndex;
      while (lastLine = lastLine + 1, lastLine < endIndex) {
        draw_vline(this,lastLine,0,0x7fffffff,0,0x7fffffff);
      }
      draw_vline(this,endIndex,0,0x7fffffff,0,local_2c);
    }
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_range(int startpos, int endpos) {
  startpos = buffer()->utf8_align(startpos);
  endpos = buffer()->utf8_align(endpos);

  int i, startLine, lastLine, startIndex, endIndex;

  /* If the range is outside of the displayed text, just return */
  if ( endpos < mFirstChar || ( startpos > mLastChar && !empty_vlines() ) )
    return;

  /* Clean up the starting and ending values */
  if ( startpos < 0 ) startpos = 0;
  if ( startpos > mBuffer->length() ) startpos = mBuffer->length();
  if ( endpos < 0 ) endpos = 0;
  if ( endpos > mBuffer->length() ) endpos = mBuffer->length();

  /* Get the starting and ending lines */
  if ( startpos < mFirstChar )
    startpos = mFirstChar;
  if ( !position_to_line( startpos, &startLine ) )
    startLine = mNVisibleLines - 1;
  if ( endpos >= mLastChar ) {
    lastLine = mNVisibleLines - 1;
  } else {
    if ( !position_to_line( endpos, &lastLine ) ) {
      /* shouldn't happen */
      lastLine = mNVisibleLines - 1;
    }
  }

  /* Get the starting and ending positions within the lines */
  startIndex = mLineStarts[ startLine ] == -1 ? 0 : startpos - mLineStarts[ startLine ];
  if ( endpos >= mLastChar )
    endIndex = INT_MAX;
  else if ( mLineStarts[ lastLine ] == -1 )
    endIndex = 0;
  else
    endIndex = endpos - mLineStarts[ lastLine ];

  /* If the starting and ending lines are the same, redisplay the single
   line between "start" and "end" */
  if ( startLine == lastLine ) {
    draw_vline( startLine, 0, INT_MAX, startIndex, endIndex );
    return;
  }

  /* Redisplay the first line from "start" */
  draw_vline( startLine, 0, INT_MAX, startIndex, INT_MAX );

  /* Redisplay the lines in between at their full width */
  for ( i = startLine + 1; i < lastLine; i++ )
    draw_vline( i, 0, INT_MAX, 0, INT_MAX );

  /* Redisplay the last line to "end" */
  draw_vline( lastLine, 0, INT_MAX, 0, endIndex );
}